

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int secp256r1_create_key_exchange(ptls_key_exchange_context_t **ctx,ptls_iovec_t *pubkey)

{
  size_t sVar1;
  st_x9_62_keyex_context_t *ctx_00;
  BN_CTX *bn_ctx;
  EC_GROUP *group;
  EC_KEY *key;
  EC_POINT *point;
  int iVar2;
  ptls_iovec_t pVar3;
  
  ctx_00 = (st_x9_62_keyex_context_t *)malloc(0x30);
  if (ctx_00 == (st_x9_62_keyex_context_t *)0x0) {
    iVar2 = 0x201;
  }
  else {
    (ctx_00->pubkey).base = (uint8_t *)0x0;
    (ctx_00->pubkey).len = 0;
    ctx_00->group = (EC_GROUP *)0x0;
    ctx_00->privkey = (EC_KEY *)0x0;
    (ctx_00->super).on_exchange = x9_62_on_exchange;
    bn_ctx = BN_CTX_new();
    ctx_00->bn_ctx = (BN_CTX *)bn_ctx;
    iVar2 = 0x201;
    if (bn_ctx != (BN_CTX *)0x0) {
      group = EC_GROUP_new_by_curve_name(0x19f);
      ctx_00->group = (EC_GROUP *)group;
      iVar2 = 0x203;
      if (group != (EC_GROUP *)0x0) {
        key = ecdh_gerenate_key((EC_GROUP *)group);
        ctx_00->privkey = key;
        if (key != (EC_KEY *)0x0) {
          point = EC_KEY_get0_public_key((EC_KEY *)key);
          pVar3 = x9_62_encode_point((EC_GROUP *)group,(EC_POINT *)point,(BN_CTX *)bn_ctx);
          ctx_00->pubkey = pVar3;
          iVar2 = 0x201;
          if (pVar3.base != (uint8_t *)0x0) {
            sVar1 = (ctx_00->pubkey).len;
            pubkey->base = (ctx_00->pubkey).base;
            pubkey->len = sVar1;
            *ctx = (ptls_key_exchange_context_t *)ctx_00;
            return 0;
          }
        }
      }
    }
    x9_62_free_context(ctx_00);
  }
  *ctx = (ptls_key_exchange_context_t *)0x0;
  pubkey->base = (uint8_t *)0x0;
  pubkey->len = 0;
  return iVar2;
}

Assistant:

static int secp256r1_create_key_exchange(ptls_key_exchange_context_t **ctx, ptls_iovec_t *pubkey)
{
    return x9_62_create_key_exchange(ctx, pubkey, NID_X9_62_prime256v1);
}